

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O0

RTFLOAT __thiscall RTMatrix4x4::matMinor(RTMatrix4x4 *this,int row,int col)

{
  int *piVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  RTFLOAT res;
  int *cc;
  int *rc;
  int col_local;
  int row_local;
  RTMatrix4x4 *this_local;
  
  lVar3 = (long)(row * 3);
  piVar1 = matMinor::map + lVar3;
  lVar4 = (long)(col * 3);
  piVar2 = matMinor::map + lVar4;
  return -(this->m_data[*piVar1][matMinor::map[lVar4 + 2]] *
          this->m_data[matMinor::map[lVar3 + 1]][matMinor::map[lVar4 + 1]]) *
         this->m_data[matMinor::map[lVar3 + 2]][*piVar2] +
         this->m_data[*piVar1][matMinor::map[lVar4 + 2]] *
         this->m_data[matMinor::map[lVar3 + 1]][*piVar2] *
         this->m_data[matMinor::map[lVar3 + 2]][matMinor::map[lVar4 + 1]] +
         this->m_data[*piVar1][matMinor::map[lVar4 + 1]] *
         this->m_data[matMinor::map[lVar3 + 1]][matMinor::map[lVar4 + 2]] *
         this->m_data[matMinor::map[lVar3 + 2]][*piVar2] +
         -(this->m_data[*piVar1][matMinor::map[lVar4 + 1]] *
          this->m_data[matMinor::map[lVar3 + 1]][*piVar2]) *
         this->m_data[matMinor::map[lVar3 + 2]][matMinor::map[lVar4 + 2]] +
         -(this->m_data[*piVar1][*piVar2] *
          this->m_data[matMinor::map[lVar3 + 1]][matMinor::map[lVar4 + 2]]) *
         this->m_data[matMinor::map[lVar3 + 2]][matMinor::map[lVar4 + 1]] +
         this->m_data[*piVar1][*piVar2] *
         this->m_data[matMinor::map[lVar3 + 1]][matMinor::map[lVar4 + 1]] *
         this->m_data[matMinor::map[lVar3 + 2]][matMinor::map[lVar4 + 2]] + 0.0;
}

Assistant:

RTFLOAT RTMatrix4x4::matMinor(const int row, const int col)
{
    static int map[] = {1, 2, 3, 0, 2, 3, 0, 1, 3, 0, 1, 2};

    int *rc;
    int *cc;
    RTFLOAT res = 0;

    rc = map + row * 3;
    cc = map + col * 3;

    res += m_data[rc[0]][cc[0]] * m_data[rc[1]][cc[1]] * m_data[rc[2]][cc[2]];
    res -= m_data[rc[0]][cc[0]] * m_data[rc[1]][cc[2]] * m_data[rc[2]][cc[1]];
    res -= m_data[rc[0]][cc[1]] * m_data[rc[1]][cc[0]] * m_data[rc[2]][cc[2]];
    res += m_data[rc[0]][cc[1]] * m_data[rc[1]][cc[2]] * m_data[rc[2]][cc[0]];
    res += m_data[rc[0]][cc[2]] * m_data[rc[1]][cc[0]] * m_data[rc[2]][cc[1]];
    res -= m_data[rc[0]][cc[2]] * m_data[rc[1]][cc[1]] * m_data[rc[2]][cc[0]];
    return res;
}